

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::Read
          (NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *this)

{
  ExprPrinter *in_RDI;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprPrinter>_>
  reader;
  TextReader<fmt::Locale> bound_reader;
  VarBoundHandler<ExprPrinter> bound_handler;
  TextReader<fmt::Locale> *in_stack_00000118;
  NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *in_stack_00000120;
  TextReader<fmt::Locale> *in_stack_00000128;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprPrinter>_>
  *in_stack_00000130;
  TextReader<fmt::Locale> *in_stack_ffffffffffffff60;
  NLHeader *in_stack_ffffffffffffff68;
  TextReader<fmt::Locale> *in_stack_ffffffffffffff70;
  TextReader<fmt::Locale> local_70;
  VarBoundHandler<ExprPrinter> local_18;
  
  if (((ulong)(in_RDI->output_).super_BasicWriter<char>.buffer_ & 1) == 0) {
    Read(in_stack_00000120,in_stack_00000118);
  }
  else {
    VarBoundHandler<ExprPrinter>::VarBoundHandler
              ((VarBoundHandler<ExprPrinter> *)in_stack_ffffffffffffff60,in_RDI);
    TextReader<fmt::Locale>::TextReader
              (in_stack_ffffffffffffff70,(TextReader<fmt::Locale> *)in_stack_ffffffffffffff68);
    NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprPrinter>_>::
    NLReader((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprPrinter>_>
              *)&stack0xffffffffffffff60,&local_70,*(NLHeader **)&in_RDI->next_expr_id_,&local_18,
             *(int *)&(in_RDI->output_).super_BasicWriter<char>.buffer_);
    NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprPrinter>_>::
    Read(in_stack_00000130,in_stack_00000128);
    Read(in_stack_00000120,in_stack_00000118);
    TextReader<fmt::Locale>::~TextReader(in_stack_ffffffffffffff60);
    VarBoundHandler<ExprPrinter>::~VarBoundHandler((VarBoundHandler<ExprPrinter> *)0x14180e);
  }
  NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::EndInput((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(in_RDI->output_).super_BasicWriter<char>._vptr_BasicWriter);
  return;
}

Assistant:

void NLReader<Reader, Handler>::Read() {
  if ((flags_ & READ_BOUNDS_FIRST) != 0) {
    // Read variable bounds first because this allows more efficient
    // problem construction.
    VarBoundHandler<Handler> bound_handler(handler_);
    Reader bound_reader(reader_);
    NLReader< Reader, VarBoundHandler<Handler> >
        reader(bound_reader, header_, bound_handler, flags_);
    reader.Read(0);
    // Read everything else.
    Read(&bound_reader);
  } else {
    Read(0);
  }
  handler_.EndInput();
}